

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Accuracy::TextureCubeMipmapCase::iterate(TextureCubeMipmapCase *this)

{
  int width;
  int height;
  TestLog *pTVar1;
  TextureCube *pTVar2;
  RenderContext *context;
  TestContext *this_00;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  NotSupportedError *this_01;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  RandomViewport viewport;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Surface idealFrame;
  Sampler sampler;
  Random rnd;
  SurfaceAccess idealDst;
  RandomViewport local_2dc;
  CoordType local_2cc;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> local_2c8;
  vector<float,_std::allocator<float>_> local_2a8;
  long local_290;
  Surface local_288;
  TestLog *local_270;
  ulong local_268;
  TextureRenderer *local_260;
  TextureCubeView local_258;
  Surface local_220;
  Sampler local_204;
  undefined1 local_1c8 [128];
  LodMode local_148;
  SurfaceAccess local_50;
  
  uVar8 = (this->m_texture->m_refTexture).m_size;
  iVar6 = uVar8 * 2;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_290 = CONCAT44(extraout_var,iVar3);
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_2dc,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),iVar6,iVar6,dVar4);
  glu::mapGLSampler(&local_204,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
  local_204.seamlessCubeMap = true;
  local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2cc = this->m_coordType;
  tcu::Surface::Surface(&local_288,local_2dc.width,local_2dc.height);
  tcu::Surface::Surface(&local_220,local_2dc.width,local_2dc.height);
  lVar10 = local_290;
  if ((iVar6 <= local_2dc.width) && (iVar6 <= local_2dc.height)) {
    glu::TextureCube::upload(this->m_texture);
    (**(code **)(lVar10 + 8))(0x84c0);
    (**(code **)(lVar10 + 0xb8))(0x8513,this->m_texture->m_glTexture);
    (**(code **)(lVar10 + 0x1360))(0x8513,0x2802,this->m_wrapS);
    (**(code **)(lVar10 + 0x1360))(0x8513,0x2803,this->m_wrapT);
    (**(code **)(lVar10 + 0x1360))(0x8513,0x2801,this->m_minFilter);
    (**(code **)(lVar10 + 0x1360))(0x8513,0x2800,0x2600);
    dVar4 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar4,"After texture setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureMipmapTests.cpp"
                    ,0x22d);
    local_2c8.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deRandom_init((deRandom *)local_1c8,7);
    randomPartition(&local_2c8,(Random *)local_1c8,0,0,local_2dc.width,local_2dc.height);
    local_270 = pTVar1;
    local_268 = (ulong)uVar8;
    if (iterate()::s_projections == '\0') {
      iterate();
    }
    if (0 < (int)((ulong)((long)local_2c8.
                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_2c8.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      local_260 = &this->m_renderer;
      lVar10 = 0xc;
      uVar9 = 0;
      do {
        iVar6 = *(int *)((long)(local_2c8.
                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + -0xc);
        iVar3 = *(int *)((long)(local_2c8.
                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + -8);
        width = *(int *)((long)(local_2c8.
                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + -4);
        height = *(int *)((long)(local_2c8.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10);
        glu::TextureTestUtil::ReferenceParams::ReferenceParams
                  ((ReferenceParams *)local_1c8,TEXTURETYPE_CUBE);
        uVar8 = (uint)uVar9;
        local_1c8._100_4_ = local_204.compareChannel;
        local_1c8._84_4_ = local_204.magFilter;
        local_1c8._88_4_ = local_204.lodThreshold;
        local_1c8[0x5c] = local_204.normalizedCoords;
        local_1c8._93_3_ = local_204._25_3_;
        local_1c8._96_4_ = local_204.compare;
        local_1c8._68_4_ = local_204.wrapS;
        local_1c8._72_4_ = local_204.wrapT;
        local_1c8._76_4_ = local_204.wrapR;
        local_1c8._80_4_ = local_204.minFilter;
        local_1c8._104_8_ = local_204.borderColor.v._0_8_;
        local_1c8._121_3_ = local_204._53_3_;
        local_1c8._124_4_ = local_204.depthStencilMode;
        local_1c8[0x78] = local_204.seamlessCubeMap;
        local_1c8._112_8_ = local_204.borderColor.v._8_8_;
        glu::TextureTestUtil::computeQuadTexCoordCube
                  (&local_2a8,(int)((uVar9 & 0xffffffff) / 6) * -6 + uVar8);
        if (local_2cc == COORDTYPE_BASIC_BIAS) {
          local_1c8[8] = local_1c8[8] | 2;
          local_1c8._28_4_ = deqp::gles2::Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar8 & 7];
        }
        else if (local_2cc == COORDTYPE_PROJECTED) {
          local_1c8[8] = local_1c8[8] | 1;
          uVar7 = (ulong)((uVar8 & 3) << 4);
          local_1c8._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar7);
          local_1c8._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar7 + 8);
        }
        (**(code **)(local_290 + 0x1a00))(local_2dc.x + iVar6,local_2dc.y + iVar3,width,height);
        deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                  (local_260,0,
                   local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,(RenderParams *)local_1c8);
        iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
        tcu::SurfaceAccess::SurfaceAccess
                  (&local_50,&local_220,(PixelFormat *)(CONCAT44(extraout_var_01,iVar5) + 8),iVar6,
                   iVar3,width,height);
        local_148 = LODMODE_EXACT;
        pTVar2 = this->m_texture;
        local_258.m_levels[5] = (pTVar2->m_refTexture).m_view.m_levels[5];
        local_258.m_numLevels = (pTVar2->m_refTexture).m_view.m_numLevels;
        local_258._4_4_ = *(undefined4 *)&(pTVar2->m_refTexture).m_view.field_0x4;
        local_258.m_levels[0] = (pTVar2->m_refTexture).m_view.m_levels[0];
        local_258.m_levels[1] = (pTVar2->m_refTexture).m_view.m_levels[1];
        local_258.m_levels[2] = (pTVar2->m_refTexture).m_view.m_levels[2];
        local_258.m_levels[3] = (pTVar2->m_refTexture).m_view.m_levels[3];
        local_258.m_levels[4] = (pTVar2->m_refTexture).m_view.m_levels[4];
        glu::TextureTestUtil::sampleTexture
                  (&local_50,&local_258,
                   local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,(ReferenceParams *)local_1c8);
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while ((long)uVar9 <
               (long)(int)((ulong)((long)local_2c8.
                                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_2c8.
                                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4));
    }
    context = this->m_renderCtx;
    local_258.m_numLevels = RGBA;
    local_258._4_4_ = UNORM_INT8;
    if ((void *)local_288.m_pixels.m_cap != (void *)0x0) {
      local_288.m_pixels.m_cap = (size_t)local_288.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1c8,(TextureFormat *)&local_258,local_288.m_width,
               local_288.m_height,1,(void *)local_288.m_pixels.m_cap);
    uVar9 = local_268;
    pTVar1 = local_270;
    glu::readPixels(context,local_2dc.x,local_2dc.y,(PixelBufferAccess *)local_1c8);
    iVar6 = (int)uVar9;
    iVar3 = iVar6 + 0xf;
    if (-1 < iVar6) {
      iVar3 = iVar6;
    }
    iVar6 = glu::TextureTestUtil::measureAccuracy
                      (pTVar1,&local_220,&local_288,(iVar3 >> 4) * (iVar3 >> 4),iVar6 * iVar6);
    this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::ostream::operator<<(local_1c8,iVar6);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_258._0_8_);
    if ((ConstPixelBufferAccess **)local_258._0_8_ != local_258.m_levels + 1) {
      operator_delete((void *)local_258._0_8_,
                      (ulong)((long)&(local_258.m_levels[1]->m_format).order + 1));
    }
    if (local_2c8.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2c8.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2c8.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c8.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&local_220);
    tcu::Surface::~Surface(&local_288);
    if (local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Too small viewport",glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureMipmapTests.cpp"
             ,0x21e);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureCubeMipmapCase::IterateResult TextureCubeMipmapCase::iterate (void)
{
	// Constants.
	const deUint32			magFilter			= GL_NEAREST;

	int						texWidth			= m_texture->getRefTexture().getSize();
	int						texHeight			= m_texture->getRefTexture().getSize();

	int						defViewportWidth	= texWidth*2;
	int						defViewportHeight	= texHeight*2;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	tcu::Sampler			sampler				= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
	sampler.seamlessCubeMap = true;

	vector<float>			texCoord;

	bool					isProjected			= m_coordType == COORDTYPE_PROJECTED;
	bool					useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface			renderedFrame		(viewport.width, viewport.height);

	// Accuracy cases test against ideal lod computation.
	tcu::Surface			idealFrame			(viewport.width, viewport.height);

	// Accuracy measurements are off unless we get the expected viewport size.
	if (viewport.width < defViewportWidth || viewport.height < defViewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Upload texture data.
	m_texture->upload();

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Compute grid.
	vector<IVec4> gridLayout;
	computeGridLayout(gridLayout, viewport.width, viewport.height);

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values \note Less agressive than in 2D case due to smaller quads.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 1.1f),
		Vec4(0.8f, 1.0f, 1.2f, 0.8f),
		Vec4(1.2f, 1.0f, 1.3f, 0.9f)
	};

	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		int				curX		= gridLayout[cellNdx].x();
		int				curY		= gridLayout[cellNdx].y();
		int				curW		= gridLayout[cellNdx].z();
		int				curH		= gridLayout[cellNdx].w();
		tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);
		ReferenceParams	params		(TEXTURETYPE_CUBE);

		params.sampler = sampler;

		DE_ASSERT(m_coordType != COORDTYPE_AFFINE); // Not supported.
		computeQuadTexCoordCube(texCoord, cubeFace);

		if (isProjected)
		{
			params.flags	|= ReferenceParams::PROJECTED;
			params.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
		}

		if (useLodBias)
		{
			params.flags	|= ReferenceParams::USE_BIAS;
			params.bias		 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
		}

		// Render with GL.
		gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
		m_renderer.renderQuad(0, &texCoord[0], params);

		// Render reference(s).
		{
			tcu::SurfaceAccess idealDst(idealFrame, m_renderCtx.getRenderTarget().getPixelFormat(), curX, curY, curW, curH);
			params.lodMode = LODMODE_EXACT;
			sampleTexture(idealDst, m_texture->getRefTexture(), &texCoord[0], params);
		}
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const int	bestScoreDiff	= (texWidth/16)*(texHeight/16);
		const int	worstScoreDiff	= texWidth*texHeight;

		int score = measureAccuracy(log, idealFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}